

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::HasOwnPropertyNoHostObjectForHeapEnum
               (Var instance,PropertyId propertyId,ScriptContext *requestContext,Var *getter,
               Var *setter)

{
  code *pcVar1;
  bool bVar2;
  TypeId typeId;
  int iVar3;
  BOOL BVar4;
  PropertyQueryFlags val;
  ScriptContext *this;
  undefined4 *puVar5;
  Var local_58;
  Var value_1;
  Var value;
  DynamicObject *dynamicObject;
  RecyclableObject *object;
  Var *setter_local;
  Var *getter_local;
  ScriptContext *requestContext_local;
  Var pvStack_18;
  PropertyId propertyId_local;
  Var instance_local;
  
  object = (RecyclableObject *)setter;
  setter_local = getter;
  getter_local = (Var *)requestContext;
  requestContext_local._4_4_ = propertyId;
  pvStack_18 = instance;
  bVar2 = TaggedNumber::Is(instance);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x6c7,"(!TaggedNumber::Is(instance))",
                                "HasOwnPropertyNoHostObjectForHeapEnum int passed");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  dynamicObject = (DynamicObject *)VarTo<Js::RecyclableObject>(pvStack_18);
  typeId = RecyclableObject::GetTypeId((RecyclableObject *)dynamicObject);
  bVar2 = StaticType::Is(typeId);
  if (bVar2) {
    instance_local._4_4_ = 0;
  }
  else {
    (object->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
         (_func_int **)0x0;
    *setter_local = (Var)0x0;
    value = VarTo<Js::DynamicObject>(pvStack_18);
    this = RecyclableObject::GetScriptContext((RecyclableObject *)value);
    bVar2 = ScriptContext::IsHeapEnumInProgress(this);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x6d0,
                                  "(dynamicObject->GetScriptContext()->IsHeapEnumInProgress())",
                                  "dynamicObject->GetScriptContext()->IsHeapEnumInProgress()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    iVar3 = (**(code **)(*value + 0x78))();
    if (iVar3 == 0) {
      iVar3 = (*(dynamicObject->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x15])
                        (dynamicObject,(ulong)requestContext_local._4_4_,setter_local,object,
                         getter_local);
      if (iVar3 == 0) {
        local_58 = (Var)0x0;
        BVar4 = RecyclableObject::GetProperty
                          (&dynamicObject->super_RecyclableObject,pvStack_18,
                           requestContext_local._4_4_,&local_58,(PropertyValueInfo *)0x0,
                           (ScriptContext *)getter_local);
        if ((BVar4 == 0) ||
           ((bVar2 = ScriptContext::IsUndeclBlockVar((ScriptContext *)getter_local,local_58), bVar2
            && ((bVar2 = VarIs<Js::ActivationObject>(pvStack_18), bVar2 ||
                (bVar2 = VarIs<Js::RootObjectBase>(pvStack_18), bVar2)))))) {
          return 0;
        }
      }
    }
    else {
      BVar4 = DynamicObject::GetAccessors
                        ((DynamicObject *)value,requestContext_local._4_4_,setter_local,
                         (Var *)object,(ScriptContext *)getter_local);
      if (BVar4 == 0) {
        value_1 = (Var)0x0;
        val = DynamicObject::GetPropertyQuery
                        ((DynamicObject *)value,pvStack_18,requestContext_local._4_4_,&value_1,
                         (PropertyValueInfo *)0x0,(ScriptContext *)getter_local);
        BVar4 = JavascriptConversion::PropertyQueryFlagsToBoolean(val);
        if ((BVar4 == 0) ||
           ((bVar2 = ScriptContext::IsUndeclBlockVar((ScriptContext *)getter_local,value_1), bVar2
            && ((bVar2 = VarIs<Js::ActivationObject>(pvStack_18), bVar2 ||
                (bVar2 = VarIs<Js::RootObjectBase>(pvStack_18), bVar2)))))) {
          return 0;
        }
      }
    }
    instance_local._4_4_ = 1;
  }
  return instance_local._4_4_;
}

Assistant:

BOOL JavascriptOperators::HasOwnPropertyNoHostObjectForHeapEnum(Var instance, PropertyId propertyId, ScriptContext* requestContext, Var& getter, Var& setter)
    {
        AssertMsg(!TaggedNumber::Is(instance), "HasOwnPropertyNoHostObjectForHeapEnum int passed");

        RecyclableObject * object = VarTo<RecyclableObject>(instance);
        if (StaticType::Is(object->GetTypeId()))
        {
            return FALSE;
        }
        getter = setter = NULL;
        DynamicObject* dynamicObject = VarTo<DynamicObject>(instance);
        Assert(dynamicObject->GetScriptContext()->IsHeapEnumInProgress());
        if (dynamicObject->UseDynamicObjectForNoHostObjectAccess())
        {
            if (!dynamicObject->DynamicObject::GetAccessors(propertyId, &getter, &setter, requestContext))
            {
                Var value = nullptr;
                if (!JavascriptConversion::PropertyQueryFlagsToBoolean(dynamicObject->DynamicObject::GetPropertyQuery(instance, propertyId, &value, NULL, requestContext)) ||
                    (requestContext->IsUndeclBlockVar(value) && (VarIs<ActivationObject>(instance) || VarIs<RootObjectBase>(instance))))
                {
                    return FALSE;
                }
            }
        }
        else
        {
            if (!object->GetAccessors(propertyId, &getter, &setter, requestContext))
            {
                Var value = nullptr;
                if (!object->GetProperty(instance, propertyId, &value, NULL, requestContext) ||
                    (requestContext->IsUndeclBlockVar(value) && (VarIs<ActivationObject>(instance) || VarIs<RootObjectBase>(instance))))
                {
                    return FALSE;
                }
            }
        }
        return TRUE;
    }